

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderOperatorTests.cpp
# Opt level: O0

BuiltinFuncGroup * __thiscall
vkt::sr::anon_unknown_0::BuiltinFuncGroup::operator<<(BuiltinFuncGroup *this,BuiltinFuncInfo *info)

{
  BuiltinFuncInfo *info_local;
  BuiltinFuncGroup *this_local;
  
  std::
  vector<vkt::sr::(anonymous_namespace)::BuiltinFuncInfo,_std::allocator<vkt::sr::(anonymous_namespace)::BuiltinFuncInfo>_>
  ::push_back(&this->funcInfos,info);
  return this;
}

Assistant:

BuiltinFuncGroup&	operator<<			(const BuiltinFuncInfo& info) { funcInfos.push_back(info); return *this; }